

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

void __thiscall Snes_Spc::cpu_write_high(Snes_Spc *this,int data,int i,rel_time_t time)

{
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffe8;
  
  if (in_EDX < 0x40) {
    *(char *)(in_RDI + 0x924 + (long)in_EDX) = (char)in_ESI;
    if (*(int *)(in_RDI + 0x8e0) != 0) {
      *(undefined1 *)(in_RDI + 0xb64 + (long)(in_EDX + 0xffc0)) =
           *(undefined1 *)(in_RDI + 0x8e4 + (long)in_EDX);
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0xb64 + (long)(in_EDX + 0xffc0)) = 0xff;
    cpu_write((Snes_Spc *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
              (rel_time_t)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void Snes_Spc::cpu_write_high( int data, int i, rel_time_t time )
{
	if ( i < rom_size )
	{
		m.hi_ram [i] = (uint8_t) data;
		if ( m.rom_enabled )
			RAM [i + rom_addr] = m.rom [i]; // restore overwritten ROM
	}
	else
	{
		assert( RAM [i + rom_addr] == (uint8_t) data );
		RAM [i + rom_addr] = cpu_pad_fill; // restore overwritten padding
		cpu_write( data, i + rom_addr - 0x10000, time );
	}
}